

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTest.cxx
# Opt level: O0

char * __thiscall cmTest::GetProperty(cmTest *this,string *prop)

{
  bool chain_00;
  cmState *this_00;
  bool chain;
  char *retVal;
  string *prop_local;
  cmTest *this_local;
  
  this_local = (cmTest *)cmPropertyMap::GetPropertyValue(&this->Properties,prop);
  if (this_local == (cmTest *)0x0) {
    this_00 = cmMakefile::GetState(this->Makefile);
    chain_00 = cmState::IsPropertyChained(this_00,prop,TEST);
    if (chain_00) {
      this_local = (cmTest *)cmMakefile::GetProperty(this->Makefile,prop,chain_00);
    }
  }
  return (char *)this_local;
}

Assistant:

const char *cmTest::GetProperty(const std::string& prop) const
{
  const char *retVal = this->Properties.GetPropertyValue(prop);
  if (!retVal)
    {
    const bool chain = this->Makefile->GetState()->
          IsPropertyChained(prop, cmProperty::TEST);
    if (chain)
      {
      return this->Makefile->GetProperty(prop, chain);
      }
    }
  return retVal;
}